

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Glucose::Heap<Glucose::SimpSolver::ElimLt>::update(Heap<Glucose::SimpSolver::ElimLt> *this,int n)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  Heap<Glucose::SimpSolver::ElimLt> *unaff_retaddr;
  int in_stack_0000001c;
  Heap<Glucose::SimpSolver::ElimLt> *in_stack_00000020;
  int in_stack_0000003c;
  Heap<Glucose::SimpSolver::ElimLt> *in_stack_00000040;
  long lVar2;
  
  lVar2 = in_RDI;
  bVar1 = inHeap(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),in_ESI);
    percolateUp(in_stack_00000020,in_stack_0000001c);
    vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),in_ESI);
    percolateDown(in_stack_00000040,in_stack_0000003c);
  }
  else {
    insert(unaff_retaddr,(int)((ulong)lVar2 >> 0x20));
  }
  return;
}

Assistant:

void update(int n)
    {
        if (!inHeap(n))
            insert(n);
        else {
            percolateUp(indices[n]);
            percolateDown(indices[n]); }
    }